

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O1

_Bool parse_view_position(element_t *element,int id,view_position_t *position)

{
  char cVar1;
  size_t sVar2;
  long lVar3;
  attribute *paVar4;
  string_t *psVar5;
  char *it;
  string_t *psVar6;
  string_t *psVar7;
  char *pcVar8;
  undefined4 in_register_00000034;
  undefined4 *puVar9;
  undefined4 uVar10;
  size_t sVar11;
  long lVar12;
  
  puVar9 = (undefined4 *)CONCAT44(in_register_00000034,id);
  for (paVar4 = element->attributes; paVar4 != (attribute *)0x0; paVar4 = paVar4->next) {
    if (paVar4->id == 0x16) {
      psVar5 = &paVar4->value;
      goto LAB_0010746c;
    }
  }
  psVar5 = (string_t *)0x0;
LAB_0010746c:
  if (psVar5 == (string_t *)0x0) goto LAB_00107a45;
  psVar7 = (string_t *)psVar5->data;
  sVar2 = psVar5->length;
  psVar5 = (string_t *)((long)&psVar7->data + sVar2);
  if ((long)sVar2 < 1) {
    pcVar8 = "none";
    psVar6 = psVar7;
  }
  else {
    sVar11 = 0;
    do {
      pcVar8 = "";
      psVar6 = (string_t *)((long)&psVar7->data + 4);
      if (sVar11 == 4) break;
      if (*(char *)((long)&psVar7->data + sVar11) != "none"[sVar11]) {
        pcVar8 = "none" + sVar11;
        psVar6 = (string_t *)((long)&psVar7->data + sVar11);
        break;
      }
      sVar11 = sVar11 + 1;
      pcVar8 = "none" + sVar2;
      psVar6 = psVar5;
    } while (sVar2 != sVar11);
  }
  cVar1 = *pcVar8;
  if (cVar1 == '\0') {
    uVar10 = 0;
  }
  else {
    if (psVar7 < psVar5) {
      lVar12 = 0;
      do {
        psVar6 = (string_t *)&psVar7->length;
        pcVar8 = "";
        if (lVar12 == 8) break;
        if (*(char *)((long)&psVar7->data + lVar12) != "xMinYMin"[lVar12]) {
          psVar6 = (string_t *)((long)&psVar7->data + lVar12);
          pcVar8 = "xMinYMin" + lVar12;
          break;
        }
        lVar3 = lVar12 + 1;
        lVar12 = lVar12 + 1;
        psVar6 = psVar5;
        pcVar8 = "xMinYMin" + ((long)psVar5 - (long)psVar7);
      } while ((string_t *)((long)&psVar7->data + lVar3) != psVar5);
    }
    else {
      psVar6 = psVar7;
      pcVar8 = "xMinYMin";
    }
    if (*pcVar8 == '\0') {
      uVar10 = 1;
    }
    else {
      if (psVar7 < psVar5) {
        lVar12 = 0;
        do {
          psVar6 = (string_t *)&psVar7->length;
          pcVar8 = "";
          if (lVar12 == 8) break;
          if (*(char *)((long)&psVar7->data + lVar12) != "xMidYMin"[lVar12]) {
            psVar6 = (string_t *)((long)&psVar7->data + lVar12);
            pcVar8 = "xMidYMin" + lVar12;
            break;
          }
          lVar3 = lVar12 + 1;
          lVar12 = lVar12 + 1;
          psVar6 = psVar5;
          pcVar8 = "xMidYMin" + ((long)psVar5 - (long)psVar7);
        } while ((string_t *)((long)&psVar7->data + lVar3) != psVar5);
      }
      else {
        psVar6 = psVar7;
        pcVar8 = "xMidYMin";
      }
      if (*pcVar8 == '\0') {
        uVar10 = 2;
      }
      else {
        if (psVar7 < psVar5) {
          lVar12 = 0;
          do {
            psVar6 = (string_t *)&psVar7->length;
            pcVar8 = "";
            if (lVar12 == 8) break;
            if (*(char *)((long)&psVar7->data + lVar12) != "xMaxYMin"[lVar12]) {
              psVar6 = (string_t *)((long)&psVar7->data + lVar12);
              pcVar8 = "xMaxYMin" + lVar12;
              break;
            }
            lVar3 = lVar12 + 1;
            lVar12 = lVar12 + 1;
            psVar6 = psVar5;
            pcVar8 = "xMaxYMin" + ((long)psVar5 - (long)psVar7);
          } while ((string_t *)((long)&psVar7->data + lVar3) != psVar5);
        }
        else {
          psVar6 = psVar7;
          pcVar8 = "xMaxYMin";
        }
        if (*pcVar8 == '\0') {
          uVar10 = 3;
        }
        else {
          if (psVar7 < psVar5) {
            lVar12 = 0;
            do {
              psVar6 = (string_t *)&psVar7->length;
              pcVar8 = "";
              if (lVar12 == 8) break;
              if (*(char *)((long)&psVar7->data + lVar12) != "xMinYMid"[lVar12]) {
                psVar6 = (string_t *)((long)&psVar7->data + lVar12);
                pcVar8 = "xMinYMid" + lVar12;
                break;
              }
              lVar3 = lVar12 + 1;
              lVar12 = lVar12 + 1;
              psVar6 = psVar5;
              pcVar8 = "xMinYMid" + ((long)psVar5 - (long)psVar7);
            } while ((string_t *)((long)&psVar7->data + lVar3) != psVar5);
          }
          else {
            psVar6 = psVar7;
            pcVar8 = "xMinYMid";
          }
          if (*pcVar8 == '\0') {
            uVar10 = 4;
          }
          else {
            if (psVar7 < psVar5) {
              lVar12 = 0;
              do {
                psVar6 = (string_t *)&psVar7->length;
                pcVar8 = "";
                if (lVar12 == 8) break;
                if (*(char *)((long)&psVar7->data + lVar12) != "xMidYMid"[lVar12]) {
                  psVar6 = (string_t *)((long)&psVar7->data + lVar12);
                  pcVar8 = "xMidYMid" + lVar12;
                  break;
                }
                lVar3 = lVar12 + 1;
                lVar12 = lVar12 + 1;
                psVar6 = psVar5;
                pcVar8 = "xMidYMid" + ((long)psVar5 - (long)psVar7);
              } while ((string_t *)((long)&psVar7->data + lVar3) != psVar5);
            }
            else {
              psVar6 = psVar7;
              pcVar8 = "xMidYMid";
            }
            if (*pcVar8 == '\0') {
              uVar10 = 5;
            }
            else {
              if (psVar7 < psVar5) {
                lVar12 = 0;
                do {
                  psVar6 = (string_t *)&psVar7->length;
                  pcVar8 = "";
                  if (lVar12 == 8) break;
                  if (*(char *)((long)&psVar7->data + lVar12) != "xMaxYMid"[lVar12]) {
                    psVar6 = (string_t *)((long)&psVar7->data + lVar12);
                    pcVar8 = "xMaxYMid" + lVar12;
                    break;
                  }
                  lVar3 = lVar12 + 1;
                  lVar12 = lVar12 + 1;
                  psVar6 = psVar5;
                  pcVar8 = "xMaxYMid" + ((long)psVar5 - (long)psVar7);
                } while ((string_t *)((long)&psVar7->data + lVar3) != psVar5);
              }
              else {
                psVar6 = psVar7;
                pcVar8 = "xMaxYMid";
              }
              if (*pcVar8 == '\0') {
                uVar10 = 6;
              }
              else {
                if (psVar7 < psVar5) {
                  lVar12 = 0;
                  do {
                    psVar6 = (string_t *)&psVar7->length;
                    pcVar8 = "";
                    if (lVar12 == 8) break;
                    if (*(char *)((long)&psVar7->data + lVar12) != "xMinYMax"[lVar12]) {
                      psVar6 = (string_t *)((long)&psVar7->data + lVar12);
                      pcVar8 = "xMinYMax" + lVar12;
                      break;
                    }
                    lVar3 = lVar12 + 1;
                    lVar12 = lVar12 + 1;
                    psVar6 = psVar5;
                    pcVar8 = "xMinYMax" + ((long)psVar5 - (long)psVar7);
                  } while ((string_t *)((long)&psVar7->data + lVar3) != psVar5);
                }
                else {
                  psVar6 = psVar7;
                  pcVar8 = "xMinYMax";
                }
                if (*pcVar8 == '\0') {
                  uVar10 = 7;
                }
                else {
                  if (psVar7 < psVar5) {
                    lVar12 = 0;
                    do {
                      psVar6 = (string_t *)&psVar7->length;
                      pcVar8 = "";
                      if (lVar12 == 8) break;
                      if (*(char *)((long)&psVar7->data + lVar12) != "xMidYMax"[lVar12]) {
                        psVar6 = (string_t *)((long)&psVar7->data + lVar12);
                        pcVar8 = "xMidYMax" + lVar12;
                        break;
                      }
                      lVar3 = lVar12 + 1;
                      lVar12 = lVar12 + 1;
                      psVar6 = psVar5;
                      pcVar8 = "xMidYMax" + ((long)psVar5 - (long)psVar7);
                    } while ((string_t *)((long)&psVar7->data + lVar3) != psVar5);
                  }
                  else {
                    psVar6 = psVar7;
                    pcVar8 = "xMidYMax";
                  }
                  if (*pcVar8 == '\0') {
                    uVar10 = 8;
                  }
                  else {
                    if (psVar7 < psVar5) {
                      lVar12 = 0;
                      do {
                        psVar6 = (string_t *)&psVar7->length;
                        pcVar8 = "";
                        if (lVar12 == 8) break;
                        if (*(char *)((long)&psVar7->data + lVar12) != "xMaxYMax"[lVar12]) {
                          psVar6 = (string_t *)((long)&psVar7->data + lVar12);
                          pcVar8 = "xMaxYMax" + lVar12;
                          break;
                        }
                        lVar3 = lVar12 + 1;
                        lVar12 = lVar12 + 1;
                        psVar6 = psVar5;
                        pcVar8 = "xMaxYMax" + ((long)psVar5 - (long)psVar7);
                      } while ((string_t *)((long)&psVar7->data + lVar3) != psVar5);
                    }
                    else {
                      psVar6 = psVar7;
                      pcVar8 = "xMaxYMax";
                    }
                    if (*pcVar8 != '\0') goto LAB_00107a45;
                    uVar10 = 9;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  *puVar9 = uVar10;
  puVar9[1] = 0;
  if (cVar1 != '\0') {
    psVar7 = psVar6;
    if (psVar6 < psVar5) {
      do {
        psVar6 = psVar7;
        if ((0x20 < (ulong)*(byte *)&psVar7->data) ||
           ((0x100002600U >> ((ulong)*(byte *)&psVar7->data & 0x3f) & 1) == 0)) break;
        psVar7 = (string_t *)((long)&psVar7->data + 1);
        psVar6 = psVar5;
      } while (psVar7 != psVar5);
    }
    if (psVar6 < psVar5) {
      lVar12 = 0;
      do {
        psVar7 = (string_t *)((long)&psVar6->data + 4);
        pcVar8 = "";
        if (lVar12 == 4) break;
        if (*(char *)((long)&psVar6->data + lVar12) != "meet"[lVar12]) {
          psVar7 = (string_t *)((long)&psVar6->data + lVar12);
          pcVar8 = "meet" + lVar12;
          break;
        }
        lVar3 = lVar12 + 1;
        lVar12 = lVar12 + 1;
        psVar7 = psVar5;
        pcVar8 = "meet" + ((long)psVar5 - (long)psVar6);
      } while ((string_t *)((long)&psVar6->data + lVar3) != psVar5);
    }
    else {
      psVar7 = psVar6;
      pcVar8 = "meet";
    }
    if (*pcVar8 == '\0') {
      uVar10 = 0;
      psVar6 = psVar7;
    }
    else {
      if (psVar6 < psVar5) {
        lVar12 = 0;
        do {
          psVar7 = (string_t *)((long)&psVar6->data + 5);
          pcVar8 = "";
          if (lVar12 == 5) break;
          if (*(char *)((long)&psVar6->data + lVar12) != "slice"[lVar12]) {
            psVar7 = (string_t *)((long)&psVar6->data + lVar12);
            pcVar8 = "slice" + lVar12;
            break;
          }
          lVar3 = lVar12 + 1;
          lVar12 = lVar12 + 1;
          psVar7 = psVar5;
          pcVar8 = "slice" + ((long)psVar5 - (long)psVar6);
        } while ((string_t *)((long)&psVar6->data + lVar3) != psVar5);
      }
      else {
        psVar7 = psVar6;
        pcVar8 = "slice";
      }
      if (*pcVar8 != '\0') goto LAB_00107a1f;
      uVar10 = 1;
      psVar6 = psVar7;
    }
    puVar9[1] = uVar10;
  }
LAB_00107a1f:
  if (psVar6 < psVar5) {
    do {
      if ((0x20 < (ulong)*(byte *)&psVar6->data) ||
         ((0x100002600U >> ((ulong)*(byte *)&psVar6->data & 0x3f) & 1) == 0)) break;
      psVar6 = (string_t *)((long)&psVar6->data + 1);
    } while (psVar6 != psVar5);
  }
LAB_00107a45:
  return SUB81(psVar5,0);
}

Assistant:

static bool parse_view_position(const element_t* element, int id, view_position_t* position)
{
    const string_t* value = find_attribute(element, id, false);
    if(value == NULL)
        return false;
    const char* it = value->data;
    const char* end = it + value->length;
    if(skip_string(&it, end, "none"))
        position->align = view_align_none;
    else if(skip_string(&it, end, "xMinYMin"))
        position->align = view_align_x_min_y_min;
    else if(skip_string(&it, end, "xMidYMin"))
        position->align = view_align_x_mid_y_min;
    else if(skip_string(&it, end, "xMaxYMin"))
        position->align = view_align_x_max_y_min;
    else if(skip_string(&it, end, "xMinYMid"))
        position->align = view_align_x_min_y_mid;
    else if(skip_string(&it, end, "xMidYMid"))
        position->align = view_align_x_mid_y_mid;
    else if(skip_string(&it, end, "xMaxYMid"))
        position->align = view_align_x_max_y_mid;
    else if(skip_string(&it, end, "xMinYMax"))
        position->align = view_align_x_min_y_max;
    else if(skip_string(&it, end, "xMidYMax"))
        position->align = view_align_x_mid_y_max;
    else if(skip_string(&it, end, "xMaxYMax"))
        position->align = view_align_x_max_y_max;
    else
        return false;
    position->scale = view_scale_meet;
    if(position->align != view_align_none) {
        skip_ws(&it, end);
        if(skip_string(&it, end, "meet"))
            position->scale = view_scale_meet;
        else if(skip_string(&it, end, "slice")) {
            position->scale = view_scale_slice;
        }
    }

    return !skip_ws(&it, end);
}